

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O1

int __thiscall ncnn::Reshape::forward(Reshape *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  void *__ptr;
  size_t sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  Mat *pMVar10;
  uint _h;
  uint _c;
  int iVar11;
  size_t sVar12;
  ulong uVar13;
  undefined4 *puVar14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  ulong uVar17;
  undefined4 *puVar18;
  ulong uVar19;
  ulong uVar20;
  undefined4 *puVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  Allocator *pAVar25;
  bool bVar26;
  uint local_124;
  uint local_10c;
  int *local_108;
  int local_ec;
  Mat local_e8;
  void *local_a0;
  Mat local_98;
  Mat *local_48;
  size_t local_40;
  void *local_38;
  
  local_a0 = (void *)bottom_blob->elemsize;
  uVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  uVar8._0_4_ = bottom_blob->h;
  uVar8._4_4_ = bottom_blob->d;
  uVar3 = bottom_blob->c;
  uVar22 = bottom_blob->d * uVar3 * uVar2 * uVar1;
  iVar11 = bottom_blob->dims;
  uVar7._0_4_ = bottom_blob->dims;
  uVar7._4_4_ = bottom_blob->w;
  local_124 = this->w;
  _h = this->h;
  local_10c = this->d;
  uVar17 = (ulong)local_10c;
  _c = this->c;
  iVar4 = this->ndim;
  if (iVar4 == 1) {
    if (local_124 == 0) {
      local_124 = uVar1;
    }
    if (local_124 == 0xffffffff) {
      local_124 = uVar22;
    }
    if ((iVar11 == 1) && (uVar1 == local_124)) goto LAB_003443b5;
  }
  if (iVar4 == 2) {
    if (local_124 == 0) {
      local_124 = uVar1;
    }
    if (_h == 0) {
      _h = uVar2;
    }
    if (local_124 == 0xffffffff) {
      local_124 = (int)uVar22 / (int)_h;
      uVar17 = (long)(int)uVar22 % (long)(int)_h & 0xffffffff;
    }
    if (_h == 0xffffffff) {
      _h = (int)uVar22 / (int)local_124;
      uVar17 = (long)(int)uVar22 % (long)(int)local_124 & 0xffffffff;
    }
    if ((iVar11 == 2) && (uVar2 == _h)) {
LAB_003443b5:
      if (top_blob != bottom_blob) {
        piVar5 = bottom_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar5 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar5;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar11 = bottom_blob->w;
        iVar4 = bottom_blob->h;
        iVar9 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar11;
        top_blob->h = iVar4;
        top_blob->d = iVar9;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
        return 0;
      }
      return 0;
    }
  }
  if (iVar4 == 3) {
    if (local_124 == 0) {
      local_124 = uVar1;
    }
    if (_h == 0) {
      _h = uVar2;
    }
    if (_c == 0) {
      _c = uVar3;
    }
    if (local_124 == 0xffffffff) {
      uVar19 = (ulong)(uint)((int)((long)(int)uVar22 / (long)(int)_c) >> 0x1f) << 0x20 |
               (long)(int)uVar22 / (long)(int)_c & 0xffffffffU;
      uVar17 = (long)uVar19 % (long)(int)_h & 0xffffffff;
      local_124 = (uint)((long)uVar19 / (long)(int)_h);
    }
    if (_h == 0xffffffff) {
      uVar19 = (ulong)(uint)((int)((long)(int)uVar22 / (long)(int)_c) >> 0x1f) << 0x20 |
               (long)(int)uVar22 / (long)(int)_c & 0xffffffffU;
      uVar17 = (long)uVar19 % (long)(int)local_124 & 0xffffffff;
      _h = (uint)((long)uVar19 / (long)(int)local_124);
    }
    if (_c == 0xffffffff) {
      uVar19 = (ulong)(uint)((int)((long)(int)uVar22 / (long)(int)_h) >> 0x1f) << 0x20 |
               (long)(int)uVar22 / (long)(int)_h & 0xffffffffU;
      uVar17 = (long)uVar19 % (long)(int)local_124 & 0xffffffff;
      _c = (uint)((long)uVar19 / (long)(int)local_124);
    }
    if ((iVar11 == 3) && (uVar3 == _c)) {
      if (top_blob != bottom_blob) {
        piVar5 = bottom_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar5 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar5;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar11 = bottom_blob->w;
        iVar4 = bottom_blob->h;
        iVar9 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar11;
        top_blob->h = iVar4;
        top_blob->d = iVar9;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
      }
      top_blob->w = local_124;
      top_blob->h = _h;
      return 0;
    }
  }
  if (iVar4 == 4) {
    if (local_124 == 0) {
      local_124 = uVar1;
    }
    if (_h == 0) {
      _h = uVar2;
    }
    if (_c == 0) {
      _c = uVar3;
    }
    if (local_10c == 0) {
      local_10c = bottom_blob->d;
    }
    if (local_124 == 0xffffffff) {
      uVar17 = (long)((ulong)(uint)((int)((long)(int)uVar22 / (long)(int)_c) >> 0x1f) << 0x20 |
                     (long)(int)uVar22 / (long)(int)_c & 0xffffffffU) / (long)(int)local_10c;
      uVar19 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
      uVar17 = (long)uVar19 % (long)(int)_h & 0xffffffff;
      local_124 = (uint)((long)uVar19 / (long)(int)_h);
    }
    if (_h == 0xffffffff) {
      uVar17 = (long)((ulong)(uint)((int)((long)(int)uVar22 / (long)(int)_c) >> 0x1f) << 0x20 |
                     (long)(int)uVar22 / (long)(int)_c & 0xffffffffU) / (long)(int)local_10c;
      uVar19 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
      uVar17 = (long)uVar19 % (long)(int)local_124 & 0xffffffff;
      _h = (uint)((long)uVar19 / (long)(int)local_124);
    }
    if (local_10c == 0xffffffff) {
      uVar17 = (long)((ulong)(uint)((int)((long)(int)uVar22 / (long)(int)_c) >> 0x1f) << 0x20 |
                     (long)(int)uVar22 / (long)(int)_c & 0xffffffffU) / (long)(int)_h;
      uVar19 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
      uVar17 = (long)uVar19 % (long)(int)local_124 & 0xffffffff;
      local_10c = (uint)((long)uVar19 / (long)(int)local_124);
    }
    if (_c == 0xffffffff) {
      uVar17 = (long)((ulong)(uint)((int)((long)(int)uVar22 / (long)(int)local_10c) >> 0x1f) << 0x20
                     | (long)(int)uVar22 / (long)(int)local_10c & 0xffffffffU) / (long)(int)_h;
      uVar19 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
      uVar17 = (long)uVar19 % (long)(int)local_124 & 0xffffffff;
      _c = (uint)((long)uVar19 / (long)(int)local_124);
    }
    if ((iVar11 == 4) && (uVar3 == _c)) {
      if (top_blob != bottom_blob) {
        piVar5 = bottom_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            __ptr = top_blob->data;
            pAVar25 = top_blob->allocator;
            if (pAVar25 == (Allocator *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (*pAVar25->_vptr_Allocator[3])(pAVar25,__ptr,uVar17);
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar5 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar5;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar11 = bottom_blob->w;
        iVar4 = bottom_blob->h;
        iVar9 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar11;
        top_blob->h = iVar4;
        top_blob->d = iVar9;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
      }
      top_blob->w = local_124;
      top_blob->h = _h;
      top_blob->d = local_10c;
      return 0;
    }
  }
  if ((((iVar11 == 4 && iVar4 == 4 || iVar11 == 3 && iVar4 == 3) && uVar3 == _c) ||
      (uVar2 == _h && (iVar11 == 2 && iVar4 == 2))) || (this->permute != 1)) {
    if (iVar4 == 1) {
      Mat::reshape(&local_e8,bottom_blob,local_124,opt->blob_allocator);
      if (&local_e8 != top_blob) {
        piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_e8.data;
        top_blob->refcount = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        top_blob->elemsize = CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
        top_blob->elempack = local_e8.elempack;
        top_blob->allocator = local_e8.allocator;
        top_blob->dims = local_e8.dims;
        top_blob->w = local_e8.w;
        top_blob->h = local_e8.h;
        top_blob->d = local_e8.d;
        top_blob->c = local_e8.c;
        top_blob->cstep = local_e8.cstep;
      }
      piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (this->ndim == 2) {
      Mat::reshape(&local_e8,bottom_blob,local_124,_h,opt->blob_allocator);
      if (&local_e8 != top_blob) {
        piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_e8.data;
        top_blob->refcount = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        top_blob->elemsize = CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
        top_blob->elempack = local_e8.elempack;
        top_blob->allocator = local_e8.allocator;
        top_blob->dims = local_e8.dims;
        top_blob->w = local_e8.w;
        top_blob->h = local_e8.h;
        top_blob->d = local_e8.d;
        top_blob->c = local_e8.c;
        top_blob->cstep = local_e8.cstep;
      }
      piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (this->ndim == 3) {
      Mat::reshape(&local_e8,bottom_blob,local_124,_h,_c,opt->blob_allocator);
      if (&local_e8 != top_blob) {
        piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_e8.data;
        top_blob->refcount = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        top_blob->elemsize = CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
        top_blob->elempack = local_e8.elempack;
        top_blob->allocator = local_e8.allocator;
        top_blob->dims = local_e8.dims;
        top_blob->w = local_e8.w;
        top_blob->h = local_e8.h;
        top_blob->d = local_e8.d;
        top_blob->c = local_e8.c;
        top_blob->cstep = local_e8.cstep;
      }
      piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (this->ndim == 4) {
      Mat::reshape(&local_e8,bottom_blob,local_124,_h,local_10c,_c,opt->blob_allocator);
      if (&local_e8 != top_blob) {
        piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_e8.data;
        top_blob->refcount = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        top_blob->elemsize = CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
        top_blob->elempack = local_e8.elempack;
        top_blob->allocator = local_e8.allocator;
        top_blob->dims = local_e8.dims;
        top_blob->w = local_e8.w;
        top_blob->h = local_e8.h;
        top_blob->d = local_e8.d;
        top_blob->c = local_e8.c;
        top_blob->cstep = local_e8.cstep;
      }
      piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep != 0) {
      return 0;
    }
    return -100;
  }
  local_e8.data = bottom_blob->data;
  piVar5 = bottom_blob->refcount;
  local_e8.refcount._0_4_ = SUB84(piVar5,0);
  local_e8.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
  local_e8.elemsize._0_4_ = SUB84(local_a0,0);
  local_e8.elemsize._4_4_ = (undefined4)((ulong)local_a0 >> 0x20);
  local_e8.elempack = bottom_blob->elempack;
  local_e8.allocator = bottom_blob->allocator;
  local_e8.cstep = bottom_blob->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  local_e8._40_8_ = uVar7;
  local_e8._48_8_ = uVar8;
  local_e8.c = uVar3;
  if (iVar11 == 2) {
    uVar1 = bottom_blob->w;
    uVar2 = bottom_blob->h;
    Mat::create(&local_e8,uVar2,uVar1,(size_t)local_a0,opt->workspace_allocator);
    if ((undefined4 *)local_e8.data != (undefined4 *)0x0 && (long)local_e8.c * local_e8.cstep != 0)
    {
      if (0 < (int)uVar1) {
        puVar18 = (undefined4 *)bottom_blob->data;
        uVar17 = 0;
        puVar21 = (undefined4 *)local_e8.data;
        do {
          uVar19 = (ulong)uVar2;
          puVar15 = puVar18;
          if (0 < (int)uVar2) {
            do {
              *puVar21 = *puVar15;
              puVar21 = puVar21 + 1;
              puVar15 = puVar15 + uVar1;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
          }
          uVar17 = uVar17 + 1;
          puVar18 = puVar18 + 1;
        } while (uVar17 != uVar1);
      }
      goto LAB_003447f2;
    }
LAB_00344862:
    local_ec = -100;
    goto LAB_00344867;
  }
LAB_003447f2:
  local_48 = top_blob;
  if (iVar11 == 3) {
    uVar1 = bottom_blob->w;
    uVar2 = bottom_blob->h;
    uVar3 = bottom_blob->c;
    Mat::create(&local_e8,uVar3,uVar1,uVar2,(size_t)local_a0,opt->workspace_allocator);
    if ((undefined4 *)local_e8.data == (undefined4 *)0x0 || (long)local_e8.c * local_e8.cstep == 0)
    goto LAB_00344862;
    if (0 < (int)uVar2) {
      uVar17 = 0;
      do {
        if (0 < (int)uVar1) {
          sVar12 = bottom_blob->elemsize;
          puVar21 = (undefined4 *)(sVar12 * uVar17 * (long)bottom_blob->w + (long)bottom_blob->data)
          ;
          puVar18 = (undefined4 *)
                    (local_e8.cstep *
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) * uVar17 +
                    (long)local_e8.data);
          sVar6 = bottom_blob->cstep;
          uVar19 = 0;
          do {
            puVar15 = puVar21;
            uVar23 = (ulong)uVar3;
            if (0 < (int)uVar3) {
              do {
                *puVar18 = *puVar15;
                puVar18 = puVar18 + 1;
                puVar15 = (undefined4 *)((long)puVar15 + sVar12 * sVar6);
                uVar23 = uVar23 - 1;
              } while (uVar23 != 0);
            }
            uVar19 = uVar19 + 1;
            puVar21 = puVar21 + 1;
          } while (uVar19 != uVar1);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar2);
    }
  }
  if (iVar11 == 4) {
    uVar1 = bottom_blob->w;
    uVar2 = bottom_blob->h;
    uVar3 = bottom_blob->d;
    uVar22 = bottom_blob->c;
    Mat::create(&local_e8,uVar22,uVar1,uVar2,uVar3,(size_t)local_a0,opt->workspace_allocator);
    bVar26 = (long)local_e8.c * local_e8.cstep == 0;
    local_ec = -100;
    if ((undefined4 *)local_e8.data == (undefined4 *)0x0 || bVar26) goto LAB_00344867;
    if (0 < (int)uVar3) {
      uVar17 = 0;
      do {
        if (0 < (int)uVar2) {
          puVar18 = (undefined4 *)
                    (local_e8.cstep *
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) * uVar17 +
                    (long)local_e8.data);
          uVar19 = 0;
          do {
            if (0 < (int)uVar1) {
              sVar12 = bottom_blob->elemsize;
              puVar21 = (undefined4 *)
                        ((long)bottom_blob->w * sVar12 * ((long)bottom_blob->h * uVar17 + uVar19) +
                        (long)bottom_blob->data);
              sVar6 = bottom_blob->cstep;
              uVar23 = 0;
              do {
                uVar13 = (ulong)uVar22;
                puVar15 = puVar21;
                if (0 < (int)uVar22) {
                  do {
                    *puVar18 = *puVar15;
                    puVar18 = puVar18 + 1;
                    puVar15 = (undefined4 *)((long)puVar15 + sVar12 * sVar6);
                    uVar13 = uVar13 - 1;
                  } while (uVar13 != 0);
                }
                uVar23 = uVar23 + 1;
                puVar21 = puVar21 + 1;
              } while (uVar23 != uVar1);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar2);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar3);
    }
    local_ec = -100;
    if ((undefined4 *)local_e8.data == (undefined4 *)0x0 || bVar26) goto LAB_00344867;
  }
  pMVar10 = local_48;
  if (this->ndim == 2) {
    Mat::reshape(&local_98,&local_e8,_h,local_124,opt->workspace_allocator);
    sVar12 = local_98.cstep;
    iVar11 = local_98.c;
    pAVar25 = local_98.allocator;
    puVar18 = (undefined4 *)local_98.data;
    piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    local_108 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    lVar24 = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
    if (local_108 != (int *)0x0) {
      LOCK();
      *local_108 = *local_108 + -1;
      UNLOCK();
      if (*local_108 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_98.data != (undefined4 *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_98.cstep = 0;
    local_98.data = (undefined4 *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
  }
  else {
    sVar12 = 0;
    iVar11 = 0;
    pAVar25 = (Allocator *)0x0;
    lVar24 = 0;
    local_108 = (int *)0x0;
    puVar18 = (undefined4 *)0x0;
    if (this->ndim == 1) {
      Mat::reshape(&local_98,&local_e8,local_124,opt->blob_allocator);
      if (&local_98 != pMVar10) {
        piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = pMVar10->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (pMVar10->allocator == (Allocator *)0x0) {
              if (pMVar10->data != (void *)0x0) {
                free(pMVar10->data);
              }
            }
            else {
              (*pMVar10->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar10->cstep = 0;
        pMVar10->data = (void *)0x0;
        pMVar10->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar10->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar10->elemsize + 4) = 0;
        pMVar10->dims = 0;
        pMVar10->w = 0;
        pMVar10->h = 0;
        pMVar10->d = 0;
        pMVar10->c = 0;
        pMVar10->data = local_98.data;
        pMVar10->refcount = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        pMVar10->elemsize = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
        pMVar10->elempack = local_98.elempack;
        pMVar10->allocator = local_98.allocator;
        pMVar10->dims = local_98.dims;
        pMVar10->w = local_98.w;
        pMVar10->h = local_98.h;
        pMVar10->d = local_98.d;
        pMVar10->c = local_98.c;
        pMVar10->cstep = local_98.cstep;
      }
      piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if ((undefined4 *)local_98.data != (undefined4 *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (pMVar10->data != (void *)0x0) {
        local_ec = -100;
        if ((long)pMVar10->c * pMVar10->cstep != 0) {
          local_ec = 0;
        }
        goto LAB_00344867;
      }
      goto LAB_00344862;
    }
  }
  if (this->ndim == 3) {
    Mat::reshape(&local_98,&local_e8,_c,local_124,_h,opt->workspace_allocator);
    piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    if (local_108 != (int *)0x0) {
      LOCK();
      *local_108 = *local_108 + -1;
      UNLOCK();
      if (*local_108 == 0) {
        if (pAVar25 == (Allocator *)0x0) {
          if (puVar18 != (undefined4 *)0x0) {
            free(puVar18);
          }
        }
        else {
          (*pAVar25->_vptr_Allocator[3])(pAVar25,puVar18);
        }
      }
    }
    sVar12 = local_98.cstep;
    iVar11 = local_98.c;
    pAVar25 = local_98.allocator;
    puVar18 = (undefined4 *)local_98.data;
    local_108 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    lVar24 = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
    if (local_108 != (int *)0x0) {
      LOCK();
      *local_108 = *local_108 + -1;
      UNLOCK();
      if (*local_108 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_98.data != (undefined4 *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_98.cstep = 0;
    local_98.data = (undefined4 *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
  }
  if (this->ndim == 4) {
    Mat::reshape(&local_98,&local_e8,_c,local_124,_h,local_10c,opt->workspace_allocator);
    piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    if (local_108 != (int *)0x0) {
      LOCK();
      *local_108 = *local_108 + -1;
      UNLOCK();
      if (*local_108 == 0) {
        if (pAVar25 == (Allocator *)0x0) {
          if (puVar18 != (undefined4 *)0x0) {
            free(puVar18);
          }
        }
        else {
          (*pAVar25->_vptr_Allocator[3])(pAVar25,puVar18);
        }
      }
    }
    sVar12 = local_98.cstep;
    iVar11 = local_98.c;
    puVar18 = (undefined4 *)local_98.data;
    local_108 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    lVar24 = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
    if (local_108 != (int *)0x0) {
      LOCK();
      *local_108 = *local_108 + -1;
      UNLOCK();
      if (*local_108 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_98.data != (undefined4 *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_98.cstep = 0;
    local_98.data = (undefined4 *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    pAVar25 = local_98.allocator;
  }
  local_ec = -100;
  if ((puVar18 != (undefined4 *)0x0) && ((long)iVar11 * sVar12 != 0)) {
    local_40 = sVar12;
    if (this->ndim == 2) {
      Mat::create(pMVar10,local_124,_h,(size_t)local_a0,opt->blob_allocator);
      puVar21 = (undefined4 *)pMVar10->data;
      if ((puVar21 == (undefined4 *)0x0) || ((long)pMVar10->c * pMVar10->cstep == 0))
      goto LAB_003456e0;
      if (0 < (int)_h) {
        uVar17 = 0;
        puVar15 = puVar18;
        do {
          uVar19 = (ulong)local_124;
          puVar14 = puVar15;
          if (0 < (int)local_124) {
            do {
              *puVar21 = *puVar14;
              puVar21 = puVar21 + 1;
              puVar14 = puVar14 + _h;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
          }
          uVar17 = uVar17 + 1;
          puVar15 = puVar15 + 1;
        } while (uVar17 != _h);
      }
    }
    pMVar10 = local_48;
    if (this->ndim == 3) {
      Mat::create(local_48,local_124,_h,_c,(size_t)local_a0,opt->blob_allocator);
      if ((pMVar10->data == (void *)0x0) || ((long)pMVar10->c * pMVar10->cstep == 0))
      goto LAB_003456e0;
      if (0 < (int)_c) {
        local_38 = local_48->data;
        sVar12 = local_48->cstep;
        sVar6 = local_48->elemsize;
        uVar17 = 0;
        puVar21 = puVar18;
        do {
          if (0 < (int)_h) {
            puVar14 = (undefined4 *)(sVar12 * sVar6 * uVar17 + (long)local_38);
            uVar19 = 0;
            puVar15 = puVar21;
            do {
              puVar16 = puVar15;
              uVar23 = (ulong)local_124;
              if (0 < (int)local_124) {
                do {
                  *puVar14 = *puVar16;
                  puVar14 = puVar14 + 1;
                  puVar16 = puVar16 + _c;
                  uVar23 = uVar23 - 1;
                } while (uVar23 != 0);
              }
              uVar19 = uVar19 + 1;
              puVar15 = (undefined4 *)((long)puVar15 + lVar24 * local_40);
            } while (uVar19 != _h);
          }
          uVar17 = uVar17 + 1;
          puVar21 = puVar21 + 1;
        } while (uVar17 != _c);
      }
    }
    pMVar10 = local_48;
    if (this->ndim == 4) {
      Mat::create(local_48,local_124,_h,local_10c,_c,(size_t)local_a0,opt->blob_allocator);
      if (((pMVar10->data != (void *)0x0) && ((long)pMVar10->c * pMVar10->cstep != 0)) &&
         (local_ec = 0, 0 < (int)_c)) {
        local_a0 = pMVar10->data;
        sVar12 = pMVar10->cstep;
        sVar6 = pMVar10->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)local_10c) {
            puVar21 = (undefined4 *)(sVar12 * sVar6 * uVar17 + (long)local_a0);
            uVar19 = 0;
            do {
              if (0 < (int)_h) {
                uVar23 = uVar17 & 0xffffffff;
                uVar13 = 0;
                do {
                  iVar11 = (int)uVar23;
                  uVar20 = (ulong)local_124;
                  if (0 < (int)local_124) {
                    do {
                      *puVar21 = *(undefined4 *)
                                  ((long)puVar18 +
                                  (long)(int)uVar23 * 4 + lVar24 * local_40 * uVar19);
                      puVar21 = puVar21 + 1;
                      uVar23 = (ulong)((int)uVar23 + _c);
                      uVar20 = uVar20 - 1;
                    } while (uVar20 != 0);
                  }
                  uVar13 = uVar13 + 1;
                  uVar23 = (ulong)(iVar11 + local_124 * _c);
                } while (uVar13 != _h);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != local_10c);
          }
          uVar17 = uVar17 + 1;
          local_ec = 0;
        } while (uVar17 != _c);
      }
    }
    else {
      local_ec = 0;
    }
  }
LAB_003456e0:
  if (local_108 != (int *)0x0) {
    LOCK();
    *local_108 = *local_108 + -1;
    UNLOCK();
    if (*local_108 == 0) {
      if (pAVar25 == (Allocator *)0x0) {
        if (puVar18 != (undefined4 *)0x0) {
          free(puVar18);
        }
      }
      else {
        (*pAVar25->_vptr_Allocator[3])(pAVar25,puVar18);
      }
    }
  }
LAB_00344867:
  piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_e8.data != (undefined4 *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_ec;
}

Assistant:

int Reshape::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;
    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c;

    int dims = bottom_blob.dims;

    // resolve out shape

    int outw = w;
    int outh = h;
    int outd = d;
    int outc = c;

    if (ndim == 1)
    {
        if (outw == 0)
            outw = bottom_blob.w;

        if (outw == -1)
            outw = total;

        if (dims == 1 && bottom_blob.w == outw)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 2)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;

        if (outw == -1)
            outw = total / outh;
        if (outh == -1)
            outh = total / outw;

        if (dims == 2 && bottom_blob.h == outh)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 3)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;

        if (outw == -1)
            outw = total / outc / outh;
        if (outh == -1)
            outh = total / outc / outw;
        if (outc == -1)
            outc = total / outh / outw;

        if (dims == 3 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            return 0;
        }
    }
    if (ndim == 4)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;
        if (outd == 0)
            outd = bottom_blob.d;

        if (outw == -1)
            outw = total / outc / outd / outh;
        if (outh == -1)
            outh = total / outc / outd / outw;
        if (outd == -1)
            outd = total / outc / outh / outw;
        if (outc == -1)
            outc = total / outd / outh / outw;

        if (dims == 4 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.d = outd;
            return 0;
        }
    }

    bool need_permute = permute == 1;
    if (dims == 2 && ndim == 2 && bottom_blob.h == outh)
        need_permute = false;
    if (dims == 3 && ndim == 3 && bottom_blob.c == outc)
        need_permute = false;
    if (dims == 4 && ndim == 4 && bottom_blob.c == outc)
        need_permute = false;

    if (need_permute)
    {
        Mat bottom_blob_permuted = bottom_blob;

        if (dims == 2)
        {
            // hw -> wh
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;

            bottom_blob_permuted.create(_h, _w, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            const float* ptr = bottom_blob;
            float* outptr = bottom_blob_permuted;

            for (int i = 0; i < _w; i++)
            {
                for (int j = 0; j < _h; j++)
                {
                    *outptr++ = ptr[j * _w + i];
                }
            }
        }
        if (dims == 3)
        {
            // chw -> hwc
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;
            int channels = bottom_blob.c;

            bottom_blob_permuted.create(channels, _w, _h, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < _h; q++)
            {
                float* outptr = bottom_blob_permuted.channel(q);

                for (int i = 0; i < _w; i++)
                {
                    for (int j = 0; j < channels; j++)
                    {
                        *outptr++ = bottom_blob.channel(j).row(q)[i];
                    }
                }
            }
        }

        if (dims == 4)
        {
            // cdhw -> dhwc
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;
            int _d = bottom_blob.d;
            int channels = bottom_blob.c;

            bottom_blob_permuted.create(channels, _w, _h, _d, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int z = 0; z < _d; z++)
            {
                float* outptr = bottom_blob_permuted.channel(z);

                for (int q = 0; q < _h; q++)
                {
                    for (int i = 0; i < _w; i++)
                    {
                        for (int j = 0; j < channels; j++)
                        {
                            *outptr++ = bottom_blob.channel(j).depth(z).row(q)[i];
                        }
                    }
                }
            }
        }

        if (ndim == 1)
        {
            top_blob = bottom_blob_permuted.reshape(outw, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        // permute on ndhwc/nhwc/nhc
        Mat top_blob_permuted;
        if (ndim == 2)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outh, outw, opt.workspace_allocator);
        }
        if (ndim == 3)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outc, outw, outh, opt.workspace_allocator);
        }
        if (ndim == 4)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outc, outw, outh, outd, opt.workspace_allocator);
        }
        if (top_blob_permuted.empty())
            return -100;

        if (ndim == 2)
        {
            // wh -> hw
            top_blob.create(outw, outh, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = top_blob_permuted;
            float* outptr = top_blob;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    *outptr++ = ptr[j * outh + i];
                }
            }
        }
        if (ndim == 3)
        {
            // hwc -> chw
            top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    const float* ptr = top_blob_permuted.channel(i);

                    for (int j = 0; j < outw; j++)
                    {
                        *outptr++ = ptr[j * outc + q];
                    }
                }
            }
        }
        if (ndim == 4)
        {
            // dhwc -> cdhw
            top_blob.create(outw, outh, outd, outc, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int k = 0; k < outd; k++)
                {
                    const float* ptr = top_blob_permuted.channel(k);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            *outptr++ = ptr[i * outw * outc + j * outc + q];
                        }
                    }
                }
            }
        }

        return 0;
    }

    if (ndim == 1)
    {
        top_blob = bottom_blob.reshape(outw, opt.blob_allocator);
    }
    if (ndim == 2)
    {
        top_blob = bottom_blob.reshape(outw, outh, opt.blob_allocator);
    }
    if (ndim == 3)
    {
        top_blob = bottom_blob.reshape(outw, outh, outc, opt.blob_allocator);
    }
    if (ndim == 4)
    {
        top_blob = bottom_blob.reshape(outw, outh, outd, outc, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    return 0;
}